

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsLink.cpp
# Opt level: O3

bool Js::ASMLink::CheckIsBuiltinFunction
               (ScriptContext *scriptContext,Var object,PropertyId propertyId,FunctionInfo *funcInfo
               )

{
  bool bVar1;
  Var aValue;
  JavascriptFunction *pJVar2;
  JavascriptMethod p_Var3;
  JavascriptMethod p_Var4;
  
  aValue = JavascriptOperators::OP_GetProperty(object,propertyId,scriptContext);
  bVar1 = ScriptContext::IsJsBuiltInEnabled(scriptContext);
  if (bVar1) {
    if (propertyId == 0xfe) {
      bVar1 = VarIs<Js::JavascriptFunction>(aValue);
      if (!bVar1) {
        return false;
      }
      pJVar2 = VarTo<Js::JavascriptFunction>(aValue);
      return pJVar2 == (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                       super_JavascriptLibraryBase).mathMax.ptr;
    }
    if (propertyId == 0x2a) {
      bVar1 = VarIs<Js::JavascriptFunction>(aValue);
      if (!bVar1) {
        return false;
      }
      pJVar2 = VarTo<Js::JavascriptFunction>(aValue);
      return pJVar2 == (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                       super_JavascriptLibraryBase).mathMin.ptr;
    }
  }
  bVar1 = VarIs<Js::JavascriptFunction>(aValue);
  if (!bVar1) {
    return false;
  }
  pJVar2 = VarTo<Js::JavascriptFunction>(aValue);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((pJVar2->functionInfo).ptr);
  p_Var4 = FunctionInfo::GetOriginalEntryPoint(funcInfo);
  return p_Var3 == p_Var4;
}

Assistant:

bool ASMLink::CheckIsBuiltinFunction(ScriptContext* scriptContext, const Var object, PropertyId propertyId, const FunctionInfo& funcInfo)
    {
        Var mathFuncObj = JavascriptOperators::OP_GetProperty(object, propertyId, scriptContext);
#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            switch (propertyId)
            {
#define ASMJS_JSBUILTIN_MATH_FUNC_NAMES(propertyId, funcName) case propertyId: \
                return VarIs<JavascriptFunction>(mathFuncObj) && \
                    VarTo<JavascriptFunction>(mathFuncObj) == scriptContext->GetLibrary()->GetMath##funcName##Function();
#include "AsmJsBuiltInNames.h"
            }
        }
#endif
        return VarIs<JavascriptFunction>(mathFuncObj) &&
            VarTo<JavascriptFunction>(mathFuncObj)->GetFunctionInfo()->GetOriginalEntryPoint() == funcInfo.GetOriginalEntryPoint();
    }